

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O2

void ssh2_channel_close_local(ssh2_channel *c,char *reason)

{
  ssh2_connection_state *psVar1;
  LogContext *ctx;
  char *ptr;
  Channel *pCVar2;
  char *pcVar3;
  
  if (c->sharectx == (ssh_sharing_connstate *)0x0) {
    psVar1 = c->connlayer;
    ptr = (*c->chan->vt->log_close_msg)(c->chan);
    if (ptr != (char *)0x0) {
      ctx = (psVar1->ppl).logctx;
      pcVar3 = " ";
      if (reason == (char *)0x0) {
        pcVar3 = "";
        reason = "";
      }
      pcVar3 = dupprintf("%s%s%s",ptr,pcVar3,reason);
      logevent_and_free(ctx,pcVar3);
    }
    safefree(ptr);
    (*c->chan->vt->free)(c->chan);
    pCVar2 = zombiechan_new();
    c->chan = pCVar2;
    return;
  }
  return;
}

Assistant:

static void ssh2_channel_close_local(struct ssh2_channel *c,
                                     const char *reason)
{
    struct ssh2_connection_state *s = c->connlayer;
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    char *msg = NULL;

    if (c->sharectx)
        return;

    msg = chan_log_close_msg(c->chan);

    if (msg)
        ppl_logevent("%s%s%s", msg, reason ? " " : "", reason ? reason : "");

    sfree(msg);

    chan_free(c->chan);
    c->chan = zombiechan_new();
}